

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O2

void __thiscall CTcDataStream::~CTcDataStream(CTcDataStream *this)

{
  ~CTcDataStream(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

CTcDataStream::~CTcDataStream()
{
    size_t i;

    /* delete the page slots if we allocated any */
    for (i = 0 ; i < page_cnt_ ; ++i)
        t3free(pages_[i]);

    /* delete the page slot array if we allocated it */
    if (pages_ != 0)
        t3free(pages_);

    /* delete our label/fixup allocator */
    delete allocator_;
}